

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

uint __thiscall
TArray<FFileList,_FFileList>::Reserve(TArray<FFileList,_FFileList> *this,uint amount)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint i;
  uint uVar4;
  FFileList *pFVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  Grow(this,amount);
  uVar1 = this->Count;
  uVar4 = uVar1 + amount;
  this->Count = uVar4;
  auVar3 = _DAT_005d6240;
  auVar2 = _DAT_005d6230;
  if (uVar1 < uVar4) {
    lVar6 = (ulong)uVar4 - (ulong)uVar1;
    lVar7 = lVar6 + -1;
    auVar9._8_4_ = (int)lVar7;
    auVar9._0_8_ = lVar7;
    auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
    pFVar5 = this->Array + (ulong)uVar1 + 1;
    uVar8 = 0;
    auVar9 = auVar9 ^ _DAT_005d6240;
    do {
      auVar10._8_4_ = (int)uVar8;
      auVar10._0_8_ = uVar8;
      auVar10._12_4_ = (int)(uVar8 >> 0x20);
      auVar10 = (auVar10 | auVar2) ^ auVar3;
      if ((bool)(~(auVar10._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar10._0_4_ ||
                  auVar9._4_4_ < auVar10._4_4_) & 1)) {
        pFVar5[-1].Filename.Chars = (char *)0x723dac;
      }
      if ((auVar10._12_4_ != auVar9._12_4_ || auVar10._8_4_ <= auVar9._8_4_) &&
          auVar10._12_4_ <= auVar9._12_4_) {
        (pFVar5->Filename).Chars = (char *)0x723dac;
      }
      uVar8 = uVar8 + 2;
      pFVar5 = pFVar5 + 2;
    } while ((lVar6 + 1U & 0xfffffffffffffffe) != uVar8);
    FString::NullString.RefCount = FString::NullString.RefCount + amount;
  }
  return uVar1;
}

Assistant:

unsigned int Reserve (unsigned int amount)
	{
		Grow (amount);
		unsigned int place = Count;
		Count += amount;
		for (unsigned int i = place; i < Count; ++i)
		{
			::new((void *)&Array[i]) T;
		}
		return place;
	}